

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editline.c
# Opt level: O2

el_status_t insert_string(char *p)

{
  char *__ptr;
  size_t __n;
  size_t __n_00;
  char *pcVar1;
  int iVar2;
  ulong uVar3;
  size_t __size;
  
  __n_00 = strlen(p);
  iVar2 = rl_end;
  __n = Length;
  pcVar1 = rl_line_buffer;
  __size = Length;
  if (Length <= (long)rl_end + __n_00) {
    __size = __n_00 + Length + 0x40;
    pcVar1 = (char *)malloc(__size);
    __ptr = rl_line_buffer;
    if (pcVar1 == (char *)0x0) {
      return CSstay;
    }
    if (__n != 0) {
      memcpy(pcVar1,rl_line_buffer,__n);
      free(__ptr);
      iVar2 = rl_end;
    }
  }
  Length = __size;
  rl_line_buffer = pcVar1;
  uVar3 = (ulong)(uint)(iVar2 - rl_point);
  pcVar1 = rl_line_buffer + (long)rl_point + uVar3;
  while( true ) {
    pcVar1 = pcVar1 + -1;
    if ((int)uVar3 < 1) break;
    pcVar1[__n_00] = *pcVar1;
    uVar3 = (ulong)((int)uVar3 - 1);
  }
  memcpy(rl_line_buffer + rl_point,p,__n_00);
  rl_end = rl_end + (int)__n_00;
  rl_line_buffer[rl_end] = '\0';
  tty_string(rl_line_buffer + rl_point);
  rl_point = (int)__n_00 + rl_point;
  return (uint)(rl_point == rl_end) * 2 + CSmove;
}

Assistant:

static el_status_t insert_string(const char *p)
{
    size_t      len;
    int         i;
    char        *line;
    char        *q;

    len = strlen(p);
    if (rl_end + len >= Length) {
        line = malloc(sizeof(char) * (Length + len + MEM_INC));
        if (!line)
            return CSstay;

        if (Length) {
            memcpy(line, rl_line_buffer, Length);
            free(rl_line_buffer);
        }

        rl_line_buffer = line;
        Length += len + MEM_INC;
    }

    for (q = &rl_line_buffer[rl_point], i = rl_end - rl_point; --i >= 0; )
        q[len + i] = q[i];

    memcpy(&rl_line_buffer[rl_point], p, len);
    rl_end += len;
    rl_line_buffer[rl_end] = '\0';
    tty_string(&rl_line_buffer[rl_point]);
    rl_point += len;

    return rl_point == rl_end ? CSstay : CSmove;
}